

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harness.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  UnitTest *pUVar3;
  TestEventListeners *this;
  TestEventListener *pTVar4;
  TestEventListener *listener;
  long lVar5;
  ulong uVar6;
  char **ppcVar7;
  char **ppcVar8;
  int local_2c;
  
  local_2c = argc;
  testing::InitGoogleMock(&local_2c,argv);
  lVar2 = (long)local_2c;
  if (1 < lVar2) {
    uVar6 = lVar2 * 8 - 8;
    ppcVar7 = argv + 1;
    if (0x1f < uVar6) {
      ppcVar8 = (char **)((long)(argv + 1) + (uVar6 & 0xffffffffffffffe0));
      lVar5 = (uVar6 >> 5) + 1;
      ppcVar7 = argv + 4;
      do {
        iVar1 = strcmp(ppcVar7[-3],"--loud");
        if (iVar1 == 0) {
          ppcVar7 = ppcVar7 + -3;
          goto LAB_0012210d;
        }
        iVar1 = strcmp(ppcVar7[-2],"--loud");
        if (iVar1 == 0) {
          ppcVar7 = ppcVar7 + -2;
          goto LAB_0012210d;
        }
        iVar1 = strcmp(ppcVar7[-1],"--loud");
        if (iVar1 == 0) {
          ppcVar7 = ppcVar7 + -1;
          goto LAB_0012210d;
        }
        iVar1 = strcmp(*ppcVar7,"--loud");
        if (iVar1 == 0) goto LAB_0012210d;
        lVar5 = lVar5 + -1;
        ppcVar7 = ppcVar7 + 4;
      } while (1 < lVar5);
      uVar6 = (long)(argv + lVar2) - (long)ppcVar8;
      ppcVar7 = ppcVar8;
    }
    lVar5 = (long)uVar6 >> 3;
    if (lVar5 == 1) {
LAB_00122065:
      iVar1 = strcmp(*ppcVar7,"--loud");
      if (iVar1 != 0) goto LAB_00121fba;
    }
    else if (lVar5 == 2) {
LAB_00122049:
      iVar1 = strcmp(*ppcVar7,"--loud");
      if (iVar1 != 0) {
        ppcVar7 = ppcVar7 + 1;
        goto LAB_00122065;
      }
    }
    else {
      if (lVar5 != 3) goto LAB_00121fba;
      iVar1 = strcmp(*ppcVar7,"--loud");
      if (iVar1 != 0) {
        ppcVar7 = ppcVar7 + 1;
        goto LAB_00122049;
      }
    }
LAB_0012210d:
    if (ppcVar7 != argv + lVar2) goto LAB_00122116;
  }
LAB_00121fba:
  pUVar3 = testing::UnitTest::GetInstance();
  this = testing::UnitTest::listeners(pUVar3);
  pTVar4 = testing::TestEventListeners::Release(this,this->default_result_printer_);
  listener = (TestEventListener *)operator_new(0x10);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__quiet_event_listener_001952b0;
  listener[1]._vptr_TestEventListener = (_func_int **)pTVar4;
  testing::TestEventListeners::Append(this,listener);
LAB_00122116:
  pUVar3 = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(pUVar3);
  return iVar1;
}

Assistant:

int main (int argc, char ** argv) {
    PSTORE_TRY {
#if PSTORE_IS_INSIDE_LLVM
        llvm::sys::PrintStackTraceOnErrorSignal (argv[0], true /* Disable crash reporting */);
#endif

        // Since Google Mock depends on Google Test, InitGoogleMock() is
        // also responsible for initializing Google Test. Therefore there's
        // no need for calling testing::InitGoogleTest() separately.
        testing::InitGoogleMock (&argc, argv);

        // Unless the user enables "loud mode" by passing the appropriate switch, we silence much of
        // google test/mock's output so that we only see detailed information about tests that fail.
        if (!loud_mode_enabled (argc, argv)) {
            // Remove the default listener
            testing::TestEventListeners & listeners =
                testing::UnitTest::GetInstance ()->listeners ();
            testing::TestEventListener * const default_printer =
                listeners.Release (listeners.default_result_printer ());

            // Add our listener. By default everything is on (as when using the default listener)
            // but here we turn everything off so we only see the 3 lines for the result (plus any
            // failures at the end), like:
            //
            // [==========] Running 149 tests from 53 test cases.
            // [==========] 149 tests from 53 test cases ran. (1 ms total)
            // [  PASSED  ] 149 tests.

            listeners.Append (new quiet_event_listener (default_printer));
        }

#if defined(_WIN32)
        // Disable all of the possible ways Windows conspires to make automated
        // testing impossible.
        ::SetErrorMode (SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#    if defined(_MSC_VER)
        ::_set_error_mode (_OUT_TO_STDERR);
        _CrtSetReportMode (_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_WARN, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ERROR, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#    endif
#endif
        return RUN_ALL_TESTS ();
    }